

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O0

void sc_import(limb_t *dst,uint8_t *src,size_t len)

{
  long in_RDX;
  byte *in_RSI;
  int fill;
  int i;
  uint64_t foo;
  lsc_t tmp;
  uint8_t *endp;
  limb_t *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  int local_88;
  int local_84;
  ulong local_80;
  ulong local_78 [11];
  byte *local_20;
  byte *local_10;
  
  local_20 = in_RSI + in_RDX;
  local_88 = 0;
  local_80 = 0;
  local_10 = in_RSI;
  for (local_84 = 0; local_84 < 10; local_84 = local_84 + 1) {
    for (; in_stack_ffffffffffffff77 = local_10 < local_20 && local_88 < 0x34,
        local_10 < local_20 && local_88 < 0x34; local_10 = local_10 + 1) {
      local_80 = (ulong)*local_10 << ((byte)local_88 & 0x3f) | local_80;
      local_88 = local_88 + 8;
    }
    local_78[local_84] = local_80 & 0xfffffffffffff;
    local_80 = local_80 >> 0x34;
    local_88 = local_88 + -0x34;
  }
  sc_barrett((limb_t *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
  return;
}

Assistant:

void
sc_import(sc_t dst, const uint8_t *src, size_t len)
{
	const uint8_t *endp = src + len;
	lsc_t tmp;
	uint64_t foo;
	int i, fill;

	fill = 0;
	foo = 0;
	for (i = 0; i < 2*K; i++) {
		while (src < endp && fill < LB) {
			foo |= (uint64_t)*src++ << fill;
			fill += 8;
		}
		
		tmp[i] = foo & MSK;

		foo >>= LB;
		fill -= LB;
	}

	sc_barrett(dst, tmp);
}